

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SyntaxNode *this;
  Type *this_00;
  bool bVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  undefined4 extraout_var_00;
  ActionBlockSyntax *pAVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WaitOrderStatement *stmt;
  socklen_t __len;
  ASTContext *extraout_RDX;
  ASTContext *src;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ulong uVar6;
  long lVar7;
  SourceRange sourceRange;
  Statement *ifFalse;
  Statement *ifTrue;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  Statement *local_a8;
  Statement *local_a0;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_98;
  StatementContext *local_88;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  SourceRange local_40;
  Expression *this_01;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  uVar6 = (syntax->names).elements._M_extent._M_extent_value + 1;
  src = context;
  local_88 = stmtCtx;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->names).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      this = *ppSVar3;
      iVar2 = Expression::bind((int)this,(sockaddr *)context,0);
      this_01 = (Expression *)CONCAT44(extraout_var,iVar2);
      bVar1 = Expression::bad(this_01);
      if (bVar1) {
LAB_0044e0d2:
        stmt = (WaitOrderStatement *)Statement::badStmt(compilation,(Statement *)0x0);
        goto LAB_0044e0e1;
      }
      this_00 = (this_01->type).ptr;
      pTVar4 = this_00->canonical;
      if (pTVar4 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar4 = this_00->canonical;
      }
      if ((pTVar4->super_Symbol).kind != EventType) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(this);
        ASTContext::addDiag(context,(DiagCode)0x310008,sourceRange);
        goto LAB_0044e0d2;
      }
      local_98._M_ptr = (pointer)this_01;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_80,(Expression **)&local_98
                );
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
      src = extraout_RDX;
    } while (uVar6 != 0);
  }
  local_a0 = (Statement *)0x0;
  local_a8 = (Statement *)0x0;
  pAVar5 = (syntax->action).ptr;
  __len = (socklen_t)local_88;
  if (pAVar5->statement != (StatementSyntax *)0x0) {
    iVar2 = Statement::bind((int)pAVar5->statement,(sockaddr *)context,__len);
    local_a0 = (Statement *)CONCAT44(extraout_var_00,iVar2);
    pAVar5 = (syntax->action).ptr;
    src = extraout_RDX_00;
  }
  if (pAVar5->elseClause != (ElseClauseSyntax *)0x0) {
    iVar2 = Statement::bind((int)(pAVar5->elseClause->clause).ptr,(sockaddr *)context,__len);
    local_a8 = (Statement *)CONCAT44(extraout_var_01,iVar2);
    src = extraout_RDX_01;
  }
  iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (local_80,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
  local_98._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar2);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::WaitOrderStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_98,&local_a0,&local_a8,&local_40);
  bVar1 = ASTContext::requireTimingAllowed(context,(stmt->super_Statement).sourceRange);
  if (!bVar1) {
    stmt = (WaitOrderStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
LAB_0044e0e1:
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return &stmt->super_Statement;
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());

    if (!context.requireTimingAllowed(result->sourceRange))
        return badStmt(compilation, result);

    return *result;
}